

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O1

void __thiscall
embree::fast_allocator_regression_test::fast_allocator_regression_test
          (fast_allocator_regression_test *this)

{
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"fast_allocator_regression_test","");
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR___cxa_pure_virtual_02202ab8
  ;
  (this->super_RegressionTest).name._M_dataplus._M_p =
       (pointer)&(this->super_RegressionTest).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_RegressionTest).name,local_48,local_48 + local_40);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_02202a78;
  BarrierSys::BarrierSys(&this->barrier,0);
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  (this->alloc)._M_t.
  super___uniq_ptr_impl<embree::FastAllocator,_std::default_delete<embree::FastAllocator>_>._M_t.
  super__Tuple_impl<0UL,_embree::FastAllocator_*,_std::default_delete<embree::FastAllocator>_>.
  super__Head_base<0UL,_embree::FastAllocator_*,_false>._M_head_impl = (FastAllocator *)0x0;
  registerRegressionTest((RegressionTest *)0xa1ad9a);
  return;
}

Assistant:

fast_allocator_regression_test() 
      : RegressionTest("fast_allocator_regression_test"), numFailed(0)
    {
      registerRegressionTest(this);
    }